

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::LoadUSDALayerFromMemory
               (uint8_t *addr,size_t length,string *asset_name,Layer *dst_layer,string *warn,
               string *err,USDLoadOptions *options)

{
  ulong uVar1;
  long lVar2;
  size_t __nbytes;
  string local_1760;
  string local_1740;
  string local_1720;
  undefined1 local_16f9;
  undefined1 local_16f8 [7];
  bool ret;
  Layer layer;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [38];
  byte local_72;
  undefined1 local_71;
  undefined4 local_70;
  bool ret_1;
  bool as_primspec;
  uint32_t load_states;
  USDAReaderConfig config;
  USDAReader reader;
  StreamReader sr;
  string *err_local;
  string *warn_local;
  Layer *dst_layer_local;
  string *asset_name_local;
  size_t length_local;
  uint8_t *addr_local;
  
  if (addr == (uint8_t *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"addr arg is nullptr.\n");
    }
    addr_local._7_1_ = false;
  }
  else if (length < 9) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"Input too short.\n");
    }
    addr_local._7_1_ = false;
  }
  else if (dst_layer == (Layer *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"dst_layher arg is nullptr.\n");
    }
    addr_local._7_1_ = false;
  }
  else {
    __nbytes = 0;
    StreamReader::StreamReader((StreamReader *)&reader,addr,length,false);
    usda::USDAReader::USDAReader((USDAReader *)&load_states,(StreamReader *)&reader);
    usda::USDAReaderConfig::USDAReaderConfig((USDAReaderConfig *)&stack0xffffffffffffff94);
    as_primspec = (bool)(options->strict_allowedToken_check & 1);
    usda::USDAReader::set_reader_config
              ((USDAReader *)&load_states,(USDAReaderConfig *)&stack0xffffffffffffff94);
    local_70 = 1;
    local_71 = 1;
    uVar1 = usda::USDAReader::read((USDAReader *)&load_states,1,(void *)0x1,__nbytes);
    local_72 = (byte)uVar1 & 1;
    if ((uVar1 & 1) == 0) {
      if (err != (string *)0x0) {
        ::std::operator+((char *)local_b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Failed to parse USDA: ");
        ::std::operator+(local_98,(char *)local_b8);
        ::std::__cxx11::string::operator+=((string *)err,(string *)local_98);
        ::std::__cxx11::string::~string((string *)local_98);
        ::std::__cxx11::string::~string(local_b8);
        usda::USDAReader::get_error_abi_cxx11_(&local_f8,(USDAReader *)&load_states);
        ::std::operator+(local_d8,(char *)&local_f8);
        ::std::__cxx11::string::operator+=((string *)err,(string *)local_d8);
        ::std::__cxx11::string::~string((string *)local_d8);
        ::std::__cxx11::string::~string((string *)&local_f8);
      }
      addr_local._7_1_ = false;
      layer._asset_resolution_userdata._4_4_ = 1;
    }
    else {
      Layer::Layer((Layer *)local_16f8);
      local_16f9 = usda::USDAReader::get_as_layer((USDAReader *)&load_states,(Layer *)local_16f8);
      if ((bool)local_16f9) {
        if (warn != (string *)0x0) {
          usda::USDAReader::get_warning_abi_cxx11_(&local_1740,(USDAReader *)&load_states);
          lVar2 = ::std::__cxx11::string::size();
          ::std::__cxx11::string::~string((string *)&local_1740);
          if (lVar2 != 0) {
            usda::USDAReader::get_warning_abi_cxx11_(&local_1760,(USDAReader *)&load_states);
            ::std::__cxx11::string::operator+=((string *)warn,(string *)&local_1760);
            ::std::__cxx11::string::~string((string *)&local_1760);
          }
        }
        Layer::operator=(dst_layer,(Layer *)local_16f8);
        addr_local._7_1_ = true;
      }
      else {
        if (err != (string *)0x0) {
          usda::USDAReader::get_error_abi_cxx11_(&local_1720,(USDAReader *)&load_states);
          ::std::__cxx11::string::operator+=((string *)err,(string *)&local_1720);
          ::std::__cxx11::string::~string((string *)&local_1720);
        }
        addr_local._7_1_ = false;
      }
      layer._asset_resolution_userdata._4_4_ = 1;
      Layer::~Layer((Layer *)local_16f8);
    }
    usda::USDAReader::~USDAReader((USDAReader *)&load_states);
  }
  return addr_local._7_1_;
}

Assistant:

bool LoadUSDALayerFromMemory(const uint8_t *addr, const size_t length,
                       const std::string &asset_name, Layer *dst_layer,
                       std::string *warn, std::string *err,
                       const USDLoadOptions &options) {

  // TODO: options
  (void)options;

  if (!addr) {
    if (err) {
      (*err) += "addr arg is nullptr.\n";
    }
    return false;
  }

  if (length < 9) {
    if (err) {
      (*err) += "Input too short.\n";
    }
    return false;
  }

  if (!dst_layer) {
    if (err) {
      (*err) += "dst_layher arg is nullptr.\n";
    }
    return false;
  }

  tinyusdz::StreamReader sr(addr, length, /* swap endian */ false);
  tinyusdz::usda::USDAReader reader(&sr);

  tinyusdz::usda::USDAReaderConfig config;
  config.strict_allowedToken_check = options.strict_allowedToken_check;
  reader.set_reader_config(config);

  uint32_t load_states = static_cast<uint32_t>(tinyusdz::LoadState::Toplevel);

  bool as_primspec = true;

  {
    bool ret = reader.read(load_states, as_primspec);

    if (!ret) {
      if (err) {
        (*err) += "Failed to parse USDA: " + asset_name + "\n";
        (*err) += reader.get_error() + "\n";
      }
      return false;
    }
  }

  tinyusdz::Layer layer;
  bool ret = reader.get_as_layer(&layer);
  if (!ret) {
    if (err) {
      (*err) += reader.get_error();
    }
    return false;
  }

  if (warn) {
    if (reader.get_warning().size()) {
      (*warn) += reader.get_warning();
    }
  }

  (*dst_layer) = std::move(layer);

  return true;
}